

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          LogicalType params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7)

{
  LogicalType params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff18;
  string local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)&local_b0,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff30,(string *)params);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffee0,(LogicalType *)params_1);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff10,(string *)params_2);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffef8,(LogicalType *)params_3);
  ::std::__cxx11::string::string(local_50,(string *)params_4._0_8_);
  ::std::__cxx11::string::string
            (local_70,(string *)
                      params_4.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  ::std::__cxx11::string::string
            (local_90,(string *)
                      params_4.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  params_4_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  params_4_00._0_8_ = local_50;
  params_4_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffee0,(LogicalType *)&stack0xffffffffffffff10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef8,params_4_00,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffef8,in_stack_ffffffffffffff18);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_50);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffef8);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffee0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  ::std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}